

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
* deqp::gls::BuiltinPrecisionTests::createES31BuiltinCases(void)

{
  BuiltinFuncs *funcs;
  MovePtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  *in_RDI;
  string local_78;
  string local_58;
  string local_38;
  
  funcs = (BuiltinFuncs *)operator_new(0x20);
  (funcs->super_CaseFactories)._vptr_CaseFactories = (_func_int **)&PTR__BuiltinFuncs_02167d48;
  (funcs->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (funcs->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (funcs->m_factories).
  super__Vector_base<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>,_std::allocator<de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::CaseFactory>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,0x1aee929);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::FrExp>(funcs,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,0x1aee929);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::LdExp>(funcs,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,0x1aee929);
  addScalarFactory<deqp::gls::BuiltinPrecisionTests::Functions::Fma>(funcs,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  (in_RDI->
  super_UniqueBase<const_deqp::gls::BuiltinPrecisionTests::CaseFactories,_de::DefaultDeleter<const_deqp::gls::BuiltinPrecisionTests::CaseFactories>_>
  ).m_data.ptr = (CaseFactories *)funcs;
  return in_RDI;
}

Assistant:

MovePtr<const CaseFactories> createES31BuiltinCases (void)
{
	MovePtr<BuiltinFuncs>	funcs	(new BuiltinFuncs());

	addScalarFactory<FrExp>(*funcs);
	addScalarFactory<LdExp>(*funcs);
	addScalarFactory<Fma>(*funcs);

	return MovePtr<const CaseFactories>(funcs.release());
}